

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinEncodeUTF8
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  byte bVar1;
  HeapEntity *pHVar2;
  HeapThunk *pHVar3;
  _Rb_tree_header *p_Var4;
  allocator_type *in_RCX;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *args_2;
  size_type sVar5;
  string *__range3;
  _Link_type __x;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  *params;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  Value VVar6;
  string byteString;
  HeapThunk *th;
  string local_a8;
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  local_88;
  Identifier **local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  size_type local_58;
  HeapThunk *local_50;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  local_48;
  
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"encodeUTF8","");
  local_88.
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_88.
                         super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x13);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_88;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector(&local_48,__l,in_RCX);
  params = &local_48;
  args_2 = args;
  validateBuiltinArgs(this,loc,&local_a8,args,params);
  if ((_Base_ptr)
      local_48.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
      ._M_impl.super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
    operator_delete(local_48.
                    super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  encode_utf8(&local_a8,
              (UString *)
              ((((args->
                 super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                 )._M_impl.super__Vector_impl_data._M_start)->v).h + 1));
  local_88.
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  VVar6 = makeArray(this,&local_88);
  (this->scratch).t = ARRAY;
  (this->scratch).v = VVar6._0_8_;
  if (local_88.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_58 = local_a8._M_string_length;
  if (local_a8._M_string_length != 0) {
    pHVar2 = (this->scratch).v.h;
    local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_a8._M_dataplus._M_p;
    local_68 = &this->idArrayElement;
    sVar5 = 0;
    do {
      bVar1 = local_60->_M_local_buf[sVar5];
      local_88.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((ulong)local_88.
                            super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                            ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
      pHVar3 = (anonymous_namespace)::Interpreter::
               makeHeap<jsonnet::internal::(anonymous_namespace)::HeapThunk,jsonnet::internal::Identifier_const*&,decltype(nullptr),int,decltype(nullptr)>
                         ((Interpreter *)this,local_68,(void **)&local_88,(int *)args_2,
                          (void **)params);
      __x = (_Link_type)&local_50;
      local_50 = pHVar3;
      std::
      vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
      ::push_back((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                   *)(pHVar2 + 1),(value_type *)__x);
      local_88.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)(double)bVar1;
      (pHVar3->content).t = NUMBER;
      (pHVar3->content).v.d =
           (double)local_88.
                   super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      (pHVar3->super_HeapEntity).field_0xa = 1;
      pHVar3->self = (HeapObject *)0x0;
      std::
      _Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
      ::_M_erase((_Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                  *)(pHVar3->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,__x);
      p_Var4 = &(pHVar3->upValues)._M_t._M_impl.super__Rb_tree_header;
      (pHVar3->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (pHVar3->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
      (pHVar3->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
      (pHVar3->upValues)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      sVar5 = sVar5 + 1;
    } while (local_58 != sVar5);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  return (AST *)0x0;
}

Assistant:

const AST *builtinEncodeUTF8(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "encodeUTF8", args, {Value::STRING});

        std::string byteString = encode_utf8(static_cast<HeapString *>(args[0].v.h)->value);

        scratch = makeArray({});
        auto &elements = static_cast<HeapArray *>(scratch.v.h)->elements;
        for (const auto c : byteString) {
            auto *th = makeHeap<HeapThunk>(idArrayElement, nullptr, 0, nullptr);
            elements.push_back(th);
            th->fill(makeNumber(uint8_t(c)));
        }
        return nullptr;
    }